

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boing.c
# Opt level: O0

void reshape(GLFWwindow *window,int w,int h)

{
  double dVar1;
  float local_bc [2];
  vec3 up;
  vec3 center;
  vec3 eye;
  mat4x4 view;
  mat4x4 projection;
  int h_local;
  int w_local;
  GLFWwindow *window_local;
  
  (*glad_glViewport)(0,0,w,h);
  (*glad_glMatrixMode)(0x1701);
  dVar1 = atan2(70.0,200.0);
  mat4x4_perspective((vec4 *)(view[3] + 2),(float)dVar1 * 2.0,(float)w / (float)h,1.0,641.0);
  (*glad_glLoadMatrixf)(view[3] + 2);
  (*glad_glMatrixMode)(0x1700);
  center[1] = 0.0;
  center[2] = 0.0;
  eye[0] = 641.0;
  memset(up + 1,0,0xc);
  local_bc[0] = 0.0;
  local_bc[1] = -1.0;
  up[0] = 0.0;
  mat4x4_look_at((vec4 *)(eye + 1),center + 1,up + 1,local_bc);
  (*glad_glLoadMatrixf)(eye + 1);
  return;
}

Assistant:

void reshape( GLFWwindow* window, int w, int h )
{
   mat4x4 projection, view;

   glViewport( 0, 0, (GLsizei)w, (GLsizei)h );

   glMatrixMode( GL_PROJECTION );
   mat4x4_perspective( projection,
                       2.f * (float) atan2( RADIUS, 200.f ),
                       (float)w / (float)h,
                       1.f, VIEW_SCENE_DIST );
   glLoadMatrixf((const GLfloat*) projection);

   glMatrixMode( GL_MODELVIEW );
   {
      vec3 eye = { 0.f, 0.f, VIEW_SCENE_DIST };
      vec3 center = { 0.f, 0.f, 0.f };
      vec3 up = { 0.f, -1.f, 0.f };
      mat4x4_look_at( view, eye, center, up );
   }
   glLoadMatrixf((const GLfloat*) view);
}